

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void do_cmd_stash(command_conflict *cmd)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t wVar2;
  store *store_00;
  _Bool local_201;
  _Bool no_room;
  object *poStack_200;
  _Bool none_left;
  object *dropped;
  object *obj;
  char local_1e8 [7];
  char label;
  char o_name [120];
  store *store;
  object dummy;
  wchar_t amt;
  command_conflict *cmd_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  store_00 = store_at((chunk *)cave,grid);
  local_201 = false;
  wVar2 = cmd_get_arg_item((command *)cmd,"item",&dropped);
  if ((wVar2 == L'\0') &&
     (wVar2 = cmd_get_quantity((command *)cmd,"quantity",(int *)((long)&dummy.note + 4),
                               (uint)dropped->number), wVar2 == L'\0')) {
    _Var1 = store_is_home(store_00);
    if (_Var1) {
      _Var1 = object_is_equipped(player->body,dropped);
      if ((!_Var1) || (_Var1 = obj_can_takeoff(dropped), _Var1)) {
        object_copy_amt((object *)&store,dropped,dummy.note._4_4_);
        _Var1 = store_check_num(store_00,(object *)&store);
        object_wipe((object *)&store);
        if (((_Var1 ^ 0xffU) & 1) == 0) {
          obj._7_1_ = gear_to_label(player,dropped);
          poStack_200 = gear_object_for_use(player,dropped,dummy.note._4_4_,false,&local_201);
          object_desc(local_1e8,0x78,poStack_200,0x43,player);
          msg("You drop %s (%c).",local_1e8,(ulong)(uint)(int)obj._7_1_);
          handle_stuff(player);
          home_carry(poStack_200);
          event_signal(EVENT_STORECHANGED);
          event_signal(EVENT_INVENTORY);
          event_signal(EVENT_EQUIPMENT);
        }
        else {
          msg("Your home is full.");
        }
      }
      else {
        msg("Hmmm, it seems to be stuck.");
      }
    }
    else {
      msg("You are not in your home.");
    }
  }
  return;
}

Assistant:

void do_cmd_stash(struct command *cmd)
{
	int amt;
	struct object dummy;
	struct store *store = store_at(cave, player->grid);
	char o_name[120];
	char label;

	struct object *obj, *dropped;
	bool none_left = false;
	bool no_room;

	if (cmd_get_arg_item(cmd, "item", &obj))
		return;

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	/* Check we are somewhere we can stash items. */
	if (!store_is_home(store)) {
		msg("You are not in your home.");
		return;
	}

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}	

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(&dummy, obj, amt);

	no_room = !store_check_num(store, &dummy);
	/*
	 * Do not need the dummy any more so release the memory allocated
	 * within it.
	 */
	object_wipe(&dummy);
	if (no_room) {
		msg("Your home is full.");
		return;
	}

	/* Get where the object is now */
	label = gear_to_label(player, obj);

	/* Now get the real item */
	dropped = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Describe */
	object_desc(o_name, sizeof(o_name), dropped,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Message */
	msg("You drop %s (%c).", o_name, label);

	/* Handle stuff */
	handle_stuff(player);

	/* Let the home carry it */
	home_carry(dropped);

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}